

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Value<google::protobuf::internal::GenericTypeHandler<std::string>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,int index)

{
  string *psVar1;
  void **ppvVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  LogMessageFatal local_20 [16];
  
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(index,0,"index >= 0");
  if (psVar1 == (string *)0x0) {
    psVar1 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_
                       (index,this->current_size_,"index < current_size_");
    if (psVar1 == (string *)0x0) {
      ppvVar2 = element_at(this,index);
      return (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)*ppvVar2;
    }
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0xbd;
  }
  else {
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0xbc;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, current_size_);
    return cast<TypeHandler>(element_at(index));
  }